

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O1

double __thiscall CholeskyFactor::density(CholeskyFactor *this)

{
  uint uVar1;
  ulong uVar2;
  pointer pdVar3;
  ulong uVar4;
  int iVar5;
  HighsInt j;
  ulong uVar6;
  double dVar7;
  
  uVar1 = this->current_k;
  uVar2 = (ulong)uVar1;
  if (uVar2 != 0) {
    if ((int)uVar1 < 1) {
      dVar7 = 0.0;
    }
    else {
      pdVar3 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 0;
      iVar5 = 0;
      do {
        uVar6 = 0;
        do {
          iVar5 = iVar5 + (uint)(1e-07 < ABS(pdVar3[uVar6]));
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + this->current_k_max;
      } while (uVar4 != uVar2);
      dVar7 = (double)iVar5;
    }
    return dVar7 / ((double)(int)((uVar1 + 1) * uVar1) * 0.5);
  }
  return 0.0;
}

Assistant:

double density() {
    if (current_k == 0) {
      return 0.0;
    }

    HighsInt num_nz = 0;
    for (HighsInt i = 0; i < current_k; i++) {
      for (HighsInt j = 0; j < current_k; j++) {
        if (fabs(L[i * current_k_max + j]) > 1e-7) {
          num_nz++;
        }
      }
    }
    return (double)num_nz / (current_k * (current_k + 1) / 2.0);
  }